

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhash.h
# Opt level: O2

iterator __thiscall
QHash<DomLayout_const*,QString>::findImpl<DomLayout_const*>
          (QHash<DomLayout_const*,QString> *this,DomLayout **key)

{
  Data<QHashPrivate::Node<DomLayout_const*,QString>> *this_00;
  Data<QHashPrivate::Node<const_DomLayout_*,_QString>_> *pDVar1;
  Data<QHashPrivate::Node<const_DomLayout_*,_QString>_> *pDVar2;
  Bucket BVar3;
  iterator iVar4;
  
  this_00 = *(Data<QHashPrivate::Node<DomLayout_const*,QString>> **)this;
  if ((this_00 == (Data<QHashPrivate::Node<DomLayout_const*,QString>> *)0x0) ||
     (*(long *)(this_00 + 8) == 0)) {
    pDVar1 = (Data<QHashPrivate::Node<const_DomLayout_*,_QString>_> *)0x0;
    pDVar2 = (Data<QHashPrivate::Node<const_DomLayout_*,_QString>_> *)0x0;
  }
  else {
    BVar3 = QHashPrivate::Data<QHashPrivate::Node<DomLayout_const*,QString>>::
            findBucket<DomLayout_const*>(this_00,key);
    pDVar2 = (Data<QHashPrivate::Node<const_DomLayout_*,_QString>_> *)
             (((long)BVar3.span - *(long *)(*(long *)this + 0x20)) / 0x90 << 7 | BVar3.index);
    QHash<const_DomLayout_*,_QString>::detach((QHash<const_DomLayout_*,_QString> *)this);
    pDVar1 = *(Data<QHashPrivate::Node<const_DomLayout_*,_QString>_> **)this;
    if ((*(Data<QHashPrivate::Node<const_DomLayout_*,_QString>_> **)this)->spans[(ulong)pDVar2 >> 7]
        .offsets[(uint)BVar3.index & 0x7f] == 0xff) {
      pDVar1 = (Data<QHashPrivate::Node<const_DomLayout_*,_QString>_> *)0x0;
      pDVar2 = (Data<QHashPrivate::Node<const_DomLayout_*,_QString>_> *)0x0;
    }
  }
  iVar4.i.bucket = (size_t)pDVar2;
  iVar4.i.d = pDVar1;
  return (iterator)iVar4.i;
}

Assistant:

iterator findImpl(const K &key)
    {
        if (isEmpty()) // prevents detaching shared null
            return end();
        auto it = d->findBucket(key);
        size_t bucket = it.toBucketIndex(d);
        detach();
        it = typename Data::Bucket(d, bucket); // reattach in case of detach
        if (it.isUnused())
            return end();
        return iterator(it.toIterator(d));
    }